

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Id __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::convertLoadedBoolInUniformToUint
          (TGlslangToSpvTraverser *this,TType *type,Id nominalTypeId,Id loadedId)

{
  Builder *this_00;
  Op OVar1;
  Id IVar2;
  Id IVar3;
  uint uVar4;
  int iVar5;
  Id loadedId_00;
  int index;
  Id elementConvertedValue;
  vector<unsigned_int,_std::allocator<unsigned_int>_> constituents;
  TType glslangElementType;
  Id local_ec;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  TType local_c8;
  
  this_00 = &this->builder;
  OVar1 = (this->builder).module.idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[nominalTypeId]->opCode;
  if (OVar1 - OpTypeBool < 3) {
    IVar2 = spv::Builder::makeBoolType(this_00);
    if (IVar2 != nominalTypeId) {
      IVar3 = spv::Builder::makeUintConstant(this_00,0,false);
LAB_0034a4ba:
      IVar2 = spv::Builder::createBinOp(this_00,OpINotEqual,IVar2,loadedId,IVar3);
      return IVar2;
    }
  }
  else if (OVar1 == OpTypeArray) {
    IVar2 = convertGlslangToSpvType(this,type,SUB41(nominalTypeId,0));
    if (IVar2 != nominalTypeId) {
      if (0x103ff < (this->glslangIntermediate->spvVersion).spv) {
        IVar2 = spv::Builder::createUnaryOp(this_00,OpCopyLogical,IVar2,loadedId);
        return IVar2;
      }
      uVar4 = 0;
      glslang::TType::TType(&local_c8,type,0,false);
      IVar3 = spv::Builder::getContainedTypeId(this_00,nominalTypeId);
      local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      while( true ) {
        iVar5 = (*type->_vptr_TType[0xf])(type);
        if (iVar5 <= (int)uVar4) break;
        loadedId_00 = spv::Builder::createCompositeExtract(this_00,loadedId,IVar3,uVar4);
        local_ec = convertLoadedBoolInUniformToUint(this,&local_c8,IVar3,loadedId_00);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8,&local_ec);
        uVar4 = uVar4 + 1;
      }
      loadedId = spv::Builder::createCompositeConstruct
                           (this_00,IVar2,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_e8);
    }
  }
  else if (OVar1 == OpTypeVector) {
    uVar4 = spv::Builder::getNumTypeConstituents(this_00,nominalTypeId);
    IVar2 = spv::Builder::makeBoolType(this_00);
    IVar2 = spv::Builder::makeVectorType(this_00,IVar2,uVar4);
    if (IVar2 != nominalTypeId) {
      IVar3 = spv::Builder::makeUintConstant(this_00,0,false);
      IVar3 = makeSmearedConstant(this,IVar3,uVar4);
      goto LAB_0034a4ba;
    }
  }
  return loadedId;
}

Assistant:

spv::Id TGlslangToSpvTraverser::convertLoadedBoolInUniformToUint(const glslang::TType& type,
                                                                 spv::Id nominalTypeId,
                                                                 spv::Id loadedId)
{
    if (builder.isScalarType(nominalTypeId)) {
        // Conversion for bool
        spv::Id boolType = builder.makeBoolType();
        if (nominalTypeId != boolType)
            return builder.createBinOp(spv::OpINotEqual, boolType, loadedId, builder.makeUintConstant(0));
    } else if (builder.isVectorType(nominalTypeId)) {
        // Conversion for bvec
        int vecSize = builder.getNumTypeComponents(nominalTypeId);
        spv::Id bvecType = builder.makeVectorType(builder.makeBoolType(), vecSize);
        if (nominalTypeId != bvecType)
            loadedId = builder.createBinOp(spv::OpINotEqual, bvecType, loadedId,
                makeSmearedConstant(builder.makeUintConstant(0), vecSize));
    } else if (builder.isArrayType(nominalTypeId)) {
        // Conversion for bool array
        spv::Id boolArrayTypeId = convertGlslangToSpvType(type);
        if (nominalTypeId != boolArrayTypeId)
        {
            // Use OpCopyLogical from SPIR-V 1.4 if available.
            if (glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_4)
                return builder.createUnaryOp(spv::OpCopyLogical, boolArrayTypeId, loadedId);

            glslang::TType glslangElementType(type, 0);
            spv::Id elementNominalTypeId = builder.getContainedTypeId(nominalTypeId);
            std::vector<spv::Id> constituents;
            for (int index = 0; index < type.getOuterArraySize(); ++index) {
                // get the element
                spv::Id elementValue = builder.createCompositeExtract(loadedId, elementNominalTypeId, index);

                // recursively convert it
                spv::Id elementConvertedValue = convertLoadedBoolInUniformToUint(glslangElementType, elementNominalTypeId, elementValue);
                constituents.push_back(elementConvertedValue);
            }
            return builder.createCompositeConstruct(boolArrayTypeId, constituents);
        }
    }

    return loadedId;
}